

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O1

UINT8 device_start_okim6258(OKIM6258_CFG *cfg,DEV_INFO *retDevInf)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  DEV_DATA DVar4;
  UINT8 UVar5;
  okim6258_state *info;
  int iVar6;
  long lVar7;
  UINT8 UVar8;
  long lVar9;
  int *piVar10;
  double dVar11;
  
  DVar4.chipInf = calloc(1,0x68);
  if ((DEV_DATA *)DVar4.chipInf == (DEV_DATA *)0x0) {
    UVar5 = 0xff;
  }
  else {
    *(UINT32 *)((long)DVar4.chipInf + 0x4c) = (cfg->_genCfg).clock;
    *(byte *)((long)DVar4.chipInf + 0x2c) = cfg->divider & 3;
    UVar5 = '\x04';
    if (cfg->adpcmBits != '\0') {
      UVar5 = cfg->adpcmBits;
    }
    *(UINT8 *)((long)DVar4.chipInf + 0x2d) = UVar5;
    if (tables_computed == '\0') {
      piVar10 = diff_lookup;
      lVar9 = 0;
      do {
        dVar11 = pow(1.1,(double)(int)lVar9);
        dVar11 = floor(dVar11 * 16.0);
        iVar3 = (int)dVar11;
        iVar6 = iVar3 + 7;
        iVar1 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar6 = iVar3;
          iVar1 = iVar3;
        }
        lVar7 = 0;
        do {
          *(int *)((long)piVar10 + lVar7) =
               ((&DAT_0017a68c)[lVar7] * (iVar1 >> 2) + (&DAT_0017a688)[lVar7] * (iVar3 / 2) +
               (&DAT_0017a684)[lVar7] * iVar3 + (iVar6 >> 3)) * (&compute_tables_nbl2bit)[lVar7];
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x40);
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + 0x10;
      } while (lVar9 != 0x31);
      tables_computed = '\x01';
    }
    iVar1 = *(int *)((long)DVar4.chipInf + 0x4c);
    *(int *)((long)DVar4.chipInf + 0x24) = iVar1;
    *(char *)((long)DVar4.chipInf + 0x46) = (char)iVar1;
    *(char *)((long)DVar4.chipInf + 0x47) = (char)((uint)iVar1 >> 8);
    *(char *)&((DEV_DATA *)((long)DVar4.chipInf + 0x48))->chipInf = (char)((uint)iVar1 >> 0x10);
    *(char *)((long)DVar4.chipInf + 0x49) = (char)((uint)iVar1 >> 0x18);
    uVar2 = dividers[*(byte *)((long)DVar4.chipInf + 0x2c)];
    *(uint *)&((DEV_DATA *)((long)DVar4.chipInf + 0x28))->chipInf = uVar2;
    UVar5 = '\0';
    ((DEV_DATA *)((long)DVar4.chipInf + 0x58))->chipInf = (void *)0x0;
    UVar8 = '\n';
    if (cfg->outputBits != '\0') {
      UVar8 = cfg->outputBits;
    }
    *(UINT8 *)((long)DVar4.chipInf + 0x31) = UVar8;
    *(short *)((long)DVar4.chipInf + 0x32) = (short)(-1 << (0xc - UVar8 & 0x1f));
    *(undefined4 *)((long)DVar4.chipInf + 0x34) = 0xfffe;
    *(undefined1 *)&((DEV_DATA *)((long)DVar4.chipInf + 0x50))->chipInf = 0;
    *(void **)DVar4.chipInf = DVar4.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = ((uVar2 >> 1) + iVar1) / uVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar5;
}

Assistant:

static UINT8 device_start_okim6258(const OKIM6258_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6258_state *info;

	info = (okim6258_state *)calloc(1, sizeof(okim6258_state));
	if (info == NULL)
		return 0xFF;

	info->initial_clock = cfg->_genCfg.clock;
	info->start_divider = cfg->divider & 0x03;
	info->adpcm_type = cfg->adpcmBits;
	if (! info->adpcm_type)
		info->adpcm_type = 4;

	compute_tables();

	info->master_clock = info->initial_clock;
	WriteLE32(info->clock_buffer, info->master_clock);
	info->divider = dividers[info->start_divider];
	info->SmpRateFunc = NULL;

	info->output_bits = cfg->outputBits;
	if (! info->output_bits)
		info->output_bits = 10;
	// D/A precision is 10-bits but 12-bit data can be output serially to an external DAC
	info->output_mask = ~((1 << (12 - info->output_bits)) - 1);

	info->signal = -2;
	info->step = 0;

	okim6258_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, get_vclk(info), &devDef);
	return 0x00;
}